

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsMuxer.cpp
# Opt level: O2

void __thiscall TSMuxer::writeOutBuffer(TSMuxer *this)

{
  int iVar1;
  uint uVar2;
  MuxerManager *this_00;
  uint8_t *buff;
  uint8_t **ppuVar3;
  uint8_t *__dest;
  uint len;
  int toFileLen;
  uint8_t *newBuf;
  uint local_44;
  uint8_t **local_40;
  uchar *local_38;
  
  iVar1 = this->m_outBufLen;
  uVar2 = this->m_writeBlockSize;
  if ((int)uVar2 <= iVar1) {
    len = uVar2 & 0xfffff800;
    this_00 = (this->super_AbstractMuxer).m_owner;
    local_44 = len;
    if (this_00->m_asyncMode == true) {
      __dest = (uint8_t *)operator_new__((long)(int)uVar2 + 0x400);
      local_40 = &this->m_outBuf;
      buff = this->m_outBuf;
      memcpy(__dest,buff + (int)len,(long)(int)(iVar1 - len));
      ppuVar3 = local_40;
      if (this->m_m2tsMode == true) {
        if ((this->m_prevM2TSPCROffset < (int)len) ||
           ((this->m_m2tsDelayBlocks).
            super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            (this->m_m2tsDelayBlocks).
            super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
            ._M_impl.super__Vector_impl_data._M_finish)) {
          std::vector<std::pair<unsigned_char*,int>,std::allocator<std::pair<unsigned_char*,int>>>::
          emplace_back<unsigned_char*&,int&>
                    ((vector<std::pair<unsigned_char*,int>,std::allocator<std::pair<unsigned_char*,int>>>
                      *)&this->m_m2tsDelayBlocks,local_40,(int *)&local_44);
          local_40 = ppuVar3;
        }
        else {
          MuxerManager::asyncWriteBuffer
                    (this_00,&this->super_AbstractMuxer,buff,len,this->m_muxFile);
          this->m_prevM2TSPCROffset = this->m_prevM2TSPCROffset - len;
        }
      }
      else {
        MuxerManager::asyncWriteBuffer(this_00,&this->super_AbstractMuxer,buff,len,this->m_muxFile);
      }
      *local_40 = __dest;
    }
    else {
      if (this->m_m2tsMode == false) {
        MuxerManager::syncWriteBuffer
                  (this_00,&this->super_AbstractMuxer,this->m_outBuf,len,this->m_muxFile);
      }
      else if ((this->m_prevM2TSPCROffset < (int)len) ||
              ((this->m_m2tsDelayBlocks).
               super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_start !=
               (this->m_m2tsDelayBlocks).
               super__Vector_base<std::pair<unsigned_char_*,_int>,_std::allocator<std::pair<unsigned_char_*,_int>_>_>
               ._M_impl.super__Vector_impl_data._M_finish)) {
        local_38 = (uchar *)operator_new__((long)(int)len);
        memcpy(local_38,this->m_outBuf,(long)(int)len);
        std::vector<std::pair<unsigned_char*,int>,std::allocator<std::pair<unsigned_char*,int>>>::
        emplace_back<unsigned_char*&,int&>
                  ((vector<std::pair<unsigned_char*,int>,std::allocator<std::pair<unsigned_char*,int>>>
                    *)&this->m_m2tsDelayBlocks,&local_38,(int *)&local_44);
        len = local_44;
      }
      else {
        MuxerManager::syncWriteBuffer
                  (this_00,&this->super_AbstractMuxer,this->m_outBuf,len,this->m_muxFile);
        this->m_prevM2TSPCROffset = this->m_prevM2TSPCROffset - len;
      }
      memmove(this->m_outBuf,this->m_outBuf + (int)len,(long)this->m_outBufLen - (long)(int)len);
    }
    this->m_outBufLen = this->m_outBufLen - local_44;
  }
  return;
}

Assistant:

void TSMuxer::writeOutBuffer()
{
    if (m_outBufLen >= m_writeBlockSize)
    {
        int toFileLen = m_writeBlockSize & ~(MuxerManager::PHYSICAL_SECTOR_SIZE - 1);
        if (m_owner->isAsyncMode())
        {
            const auto newBuf = new uint8_t[m_writeBlockSize + 1024];
            memcpy(newBuf, m_outBuf + toFileLen, m_outBufLen - toFileLen);
            if (m_m2tsMode)
            {
                if (m_prevM2TSPCROffset >= toFileLen && m_m2tsDelayBlocks.empty())
                {
                    m_owner->asyncWriteBuffer(this, m_outBuf, toFileLen, m_muxFile);
                    m_prevM2TSPCROffset -= toFileLen;
                }
                else
                    m_m2tsDelayBlocks.emplace_back(m_outBuf, toFileLen);
            }
            else
                m_owner->asyncWriteBuffer(this, m_outBuf, toFileLen, m_muxFile);
            m_outBuf = newBuf;
        }
        else
        {
            if (!m_m2tsMode)
                m_owner->syncWriteBuffer(this, m_outBuf, toFileLen, m_muxFile);
            else
            {
                if (m_prevM2TSPCROffset >= toFileLen && m_m2tsDelayBlocks.empty())
                {
                    m_owner->syncWriteBuffer(this, m_outBuf, toFileLen, m_muxFile);
                    m_prevM2TSPCROffset -= toFileLen;
                }
                else
                {
                    auto newBuf = new uint8_t[toFileLen];
                    memcpy(newBuf, m_outBuf, toFileLen);
                    m_m2tsDelayBlocks.emplace_back(newBuf, toFileLen);
                }
            }
            memmove(m_outBuf, m_outBuf + toFileLen, m_outBufLen - toFileLen);
        }
        m_outBufLen -= toFileLen;
    }
}